

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenstream.h
# Opt level: O2

Token * embree::Token::Eof(void)

{
  Token *in_RDI;
  ParseLocation local_28;
  
  local_28.fileName.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_28.fileName.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_28.lineNumber._0_4_ = 0xffffffff;
  local_28.lineNumber._4_4_ = 0xffffffff;
  local_28.colNumber._0_4_ = 0xffffffff;
  local_28.colNumber._4_4_ = 0xffffffff;
  Token(in_RDI,&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_28.fileName.
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return in_RDI;
}

Assistant:

static Token Eof()                { return Token(); }